

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::collectremovepoints(tetgenmesh *this,arraypool *remptlist)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  verttype vVar4;
  int iVar5;
  arraypool *this_00;
  char *pcVar6;
  uint uVar7;
  double dVar8;
  uint local_90;
  int i_2;
  int remcount;
  int i_1;
  int randindex;
  point swappt;
  point *parypt_i;
  arraypool *intptlist;
  int index;
  long bak_count;
  double dStack_40;
  int i;
  double smlen;
  double len;
  char *pcStack_28;
  verttype vt;
  point *parypt;
  point ptloop;
  arraypool *remptlist_local;
  tetgenmesh *this_local;
  
  ptloop = (point)remptlist;
  remptlist_local = (arraypool *)this;
  if (this->b->metric != 0) {
    memorypool::traversalinit(this->points);
    parypt = (point *)pointtraverse(this);
    while (parypt != (point *)0x0) {
      if (0.0 < (double)parypt[this->pointmtrindex]) {
        getvertexstar(this,1,(point)parypt,this->cavetetlist,this->cavetetvertlist,(arraypool *)0x0)
        ;
        pcStack_28 = this->cavetetvertlist->toparray
                     [0 >> ((byte)this->cavetetvertlist->log2objectsperblock & 0x1f)];
        dStack_40 = distance(this,(double *)parypt,*(double **)pcStack_28);
        for (bak_count._4_4_ = 1; (long)(int)bak_count._4_4_ < this->cavetetvertlist->objects;
            bak_count._4_4_ = bak_count._4_4_ + 1) {
          pcStack_28 = this->cavetetvertlist->toparray
                       [(int)bak_count._4_4_ >>
                        ((byte)this->cavetetvertlist->log2objectsperblock & 0x1f)] +
                       (int)((bak_count._4_4_ & this->cavetetvertlist->objectsperblockmark) *
                            this->cavetetvertlist->objectbytes);
          dVar8 = distance(this,(double *)parypt,*(double **)pcStack_28);
          if (dVar8 < dStack_40) {
            dStack_40 = dVar8;
          }
        }
        arraypool::restart(this->cavetetvertlist);
        arraypool::restart(this->cavetetlist);
        if (dStack_40 < (double)parypt[this->pointmtrindex]) {
          pinfect(this,(point)parypt);
          arraypool::newindex((arraypool *)ptloop,&stack0xffffffffffffffd8);
          *(point **)pcStack_28 = parypt;
        }
      }
      parypt = (point *)pointtraverse(this);
    }
    if (1 < this->b->verbose) {
      printf("    Coarsen %ld oversized points.\n",ptloop[4]);
    }
  }
  if (this->in->pointmarkerlist != (int *)0x0) {
    dVar8 = ptloop[4];
    memorypool::traversalinit(this->points);
    parypt = (point *)pointtraverse(this);
    intptlist._4_4_ = 0;
    while ((parypt != (point *)0x0 && (intptlist._4_4_ < this->in->numberofpoints))) {
      if (this->in->pointmarkerlist[intptlist._4_4_] == -1) {
        pinfect(this,(point)parypt);
        arraypool::newindex((arraypool *)ptloop,&stack0xffffffffffffffd8);
        *(point **)pcStack_28 = parypt;
      }
      intptlist._4_4_ = intptlist._4_4_ + 1;
      parypt = (point *)pointtraverse(this);
    }
    if (1 < this->b->verbose) {
      printf("    Coarsen %ld marked points.\n",(long)ptloop[4] - (long)dVar8);
    }
  }
  if (0 < this->b->coarsen_param) {
    if (1 < this->b->verbose) {
      printf("    Coarsen %g percent of interior points.\n",this->b->coarsen_percent * 100.0);
    }
    this_00 = (arraypool *)operator_new(0x30);
    arraypool::arraypool(this_00,8,10);
    memorypool::traversalinit(this->points);
    parypt = (point *)pointtraverse(this);
    while (parypt != (point *)0x0) {
      vVar4 = pointtype(this,(point)parypt);
      if ((((vVar4 == VOLVERTEX) || (vVar4 == FREEVOLVERTEX)) || (vVar4 == FREEFACETVERTEX)) ||
         (vVar4 == FREESEGVERTEX)) {
        arraypool::newindex(this_00,&stack0xffffffffffffffd8);
        *(point **)pcStack_28 = parypt;
      }
      parypt = (point *)pointtraverse(this);
    }
    if (0 < this_00->objects) {
      srand((uint)this_00->objects);
      for (i_2 = 0; (long)i_2 < this_00->objects; i_2 = i_2 + 1) {
        iVar5 = rand();
        uVar7 = iVar5 % (i_2 + 1);
        pcStack_28 = this_00->toparray[(int)uVar7 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                     (int)((uVar7 & this_00->objectsperblockmark) * this_00->objectbytes);
        uVar1 = *(undefined8 *)
                 (this_00->toparray[i_2 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                 (i_2 & this_00->objectsperblockmark) * this_00->objectbytes);
        *(undefined8 *)
         (this_00->toparray[i_2 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
         (i_2 & this_00->objectsperblockmark) * this_00->objectbytes) = *(undefined8 *)pcStack_28;
        *(undefined8 *)pcStack_28 = uVar1;
      }
      lVar2 = this_00->objects;
      dVar8 = this->b->coarsen_percent;
      for (i_2 = 0; i_2 < (int)((double)lVar2 * dVar8); i_2 = i_2 + 1) {
        pcVar6 = this_00->toparray[i_2 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                 (i_2 & this_00->objectsperblockmark) * this_00->objectbytes;
        bVar3 = pinfected(this,*(point *)pcVar6);
        if (!bVar3) {
          pinfected(this,*(point *)pcVar6);
          arraypool::newindex((arraypool *)ptloop,&stack0xffffffffffffffd8);
          *(undefined8 *)pcStack_28 = *(undefined8 *)pcVar6;
        }
      }
    }
    if (this_00 != (arraypool *)0x0) {
      arraypool::~arraypool(this_00);
      operator_delete(this_00,0x30);
    }
  }
  for (local_90 = 0; (long)(int)local_90 < (long)ptloop[4]; local_90 = local_90 + 1) {
    pcStack_28 = (char *)(*(long *)((long)ptloop[3] +
                                   (long)((int)local_90 >>
                                         ((byte)*(undefined4 *)(ptloop + 1) & 0x1f)) * 8) +
                         (long)(int)((local_90 & *(uint *)((long)ptloop + 0xc)) * *(int *)ptloop));
    puninfect(this,*(point *)pcStack_28);
  }
  return;
}

Assistant:

void tetgenmesh::collectremovepoints(arraypool *remptlist)
{
  point ptloop, *parypt;
  verttype vt;

  // If a mesh sizing function is given. Collect vertices whose mesh size
  //   is greater than its smallest edge length.
  if (b->metric) { // -m option
    REAL len, smlen;
    int i;
    points->traversalinit();
    ptloop = pointtraverse();
    while (ptloop != NULL) {
      if (ptloop[pointmtrindex] > 0) {
        // Get the smallest edge length at this vertex.
        getvertexstar(1, ptloop, cavetetlist, cavetetvertlist, NULL);
        parypt = (point *) fastlookup(cavetetvertlist, 0);
        smlen = distance(ptloop, *parypt);
        for (i = 1; i < cavetetvertlist->objects; i++) {
          parypt = (point *) fastlookup(cavetetvertlist, i);
          len = distance(ptloop, *parypt);
          if (len < smlen) {
            smlen = len;
          }
        }
        cavetetvertlist->restart();
        cavetetlist->restart();
        if (smlen < ptloop[pointmtrindex]) {
          pinfect(ptloop);
          remptlist->newindex((void **) &parypt);
          *parypt = ptloop;
        }
      }
      ptloop = pointtraverse();
    }
    if (b->verbose > 1) {
      printf("    Coarsen %ld oversized points.\n", remptlist->objects); 
    }
  }

  // If 'in->pointmarkerlist' exists, Collect vertices with markers '-1'.
  if (in->pointmarkerlist != NULL) {
    long bak_count = remptlist->objects;
    points->traversalinit();
    ptloop = pointtraverse();
    int index = 0;
    while (ptloop != NULL) {
      if (index < in->numberofpoints) {
        if (in->pointmarkerlist[index] == -1) {
          pinfect(ptloop);
          remptlist->newindex((void **) &parypt);
          *parypt = ptloop;
        }
      } else {
        // Remaining are not input points. Stop here.
        break; 
      }
      index++;
      ptloop = pointtraverse();
    }
    if (b->verbose > 1) {
      printf("    Coarsen %ld marked points.\n", remptlist->objects - bak_count); 
    }
  } // if (in->pointmarkerlist != NULL)

  if (b->coarsen_param > 0) { // -R1/#
    // Remove a coarsen_percent number of interior points.
    if (b->verbose > 1) {
      printf("    Coarsen %g percent of interior points.\n", 
             b->coarsen_percent * 100.0);
    }
    arraypool *intptlist = new arraypool(sizeof(point *), 10);
    // Count the total number of interior points.
    points->traversalinit();
    ptloop = pointtraverse();
    while (ptloop != NULL) {
      vt = pointtype(ptloop);
      if ((vt == VOLVERTEX) || (vt == FREEVOLVERTEX) || 
          (vt == FREEFACETVERTEX) || (vt == FREESEGVERTEX)) {
        intptlist->newindex((void **) &parypt);
        *parypt = ptloop;
      }
      ptloop = pointtraverse();
    }
    if (intptlist->objects > 0l) {
      // Sort the list of points randomly.
      point *parypt_i, swappt;
      int randindex, i;
      srand(intptlist->objects);
      for (i = 0; i < intptlist->objects; i++) {
        randindex = rand() % (i + 1); // randomnation(i + 1);
        parypt_i = (point *) fastlookup(intptlist, i); 
        parypt = (point *) fastlookup(intptlist, randindex);
        // Swap this two points.
        swappt = *parypt_i;
        *parypt_i = *parypt;
        *parypt = swappt;
      }
      int remcount = (int) ((REAL) intptlist->objects * b->coarsen_percent);
      // Return the first remcount points.
      for (i = 0; i < remcount; i++) {
        parypt_i = (point *) fastlookup(intptlist, i);
        if (!pinfected(*parypt_i)) {
          pinfected(*parypt_i);
          remptlist->newindex((void **) &parypt);
          *parypt = *parypt_i;
        }
      }
    }
    delete intptlist;
  }

  // Unmark all collected vertices.
  for (int i = 0; i < remptlist->objects; i++) {
    parypt = (point *) fastlookup(remptlist, i);
    puninfect(*parypt);
  }
}